

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O0

bool Cipher::generateClusters(TParameters *params,int n,TClusters *clusters)

{
  value_type vVar1;
  const_reference pvVar2;
  reference pvVar3;
  mapped_type_conflict *pmVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  int i_1;
  int cid;
  int i;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> used;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar5;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar6;
  int iVar7;
  undefined4 in_stack_ffffffffffffffa4;
  int local_4c;
  key_type_conflict *in_stack_ffffffffffffffb8;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  *in_stack_ffffffffffffffc0;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1a8372);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             0x1a838b);
  for (local_4c = 0; local_4c < in_ESI; local_4c = local_4c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)local_4c);
    if (-1 < *pvVar2) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)local_4c);
      vVar1 = *pvVar2;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_4c);
      *pvVar3 = vVar1;
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)local_4c);
      pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      *pmVar4 = true;
    }
  }
  iVar6 = 0;
  for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)iVar5);
    if (*pvVar2 < 0) {
      while (pmVar4 = std::
                      map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                      operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
            (*pmVar4 & 1U) != 0) {
        iVar6 = iVar6 + 1;
        if (*(int *)(in_RDI + 4) <= iVar6) {
          iVar6 = 0;
        }
      }
      iVar7 = iVar6;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar5);
      *pvVar3 = iVar6;
      iVar6 = iVar7 + 1;
      if (*(int *)(in_RDI + 4) <= iVar6) {
        iVar6 = 0;
      }
    }
  }
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::~map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             0x1a8529);
  return true;
}

Assistant:

bool generateClusters(const TParameters & params, int n, TClusters & clusters) {
        clusters.clear();
        clusters.resize(n);

        std::map<int, bool> used;
        for (int i = 0; i < n; ++i) {
            if (params.hint[i] < 0) continue;
            clusters[i] = params.hint[i];
            used[params.hint[i]] = true;
        }

        int cid = 0;
        for (int i = 0; i < n; ++i) {
            if (params.hint[i] >= 0) continue;
            //clusters[i] = rand()%params.maxClusters;
            while (used[cid]) {
                if (++cid >= params.maxClusters) cid = 0;
            }
            clusters[i] = cid;
            if (++cid >= params.maxClusters) cid = 0;
        }

        return true;
    }